

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TFunction * __thiscall
glslang::TParseContext::findFunctionExact
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  TSymbolTable *this_00;
  int iVar1;
  undefined4 extraout_var;
  TSymbol *pTVar2;
  undefined4 extraout_var_00;
  char *pcVar3;
  undefined4 extraout_var_01;
  TSymbol *symbol;
  bool *builtIn_local;
  TFunction *call_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  this_00 = (this->super_TParseContextBase).symbolTable;
  iVar1 = (*(call->super_TSymbol)._vptr_TSymbol[6])();
  pTVar2 = TSymbolTable::find(this_00,(TString *)CONCAT44(extraout_var,iVar1),builtIn,(bool *)0x0,
                              (int *)0x0);
  if (pTVar2 == (TSymbol *)0x0) {
    iVar1 = (*(call->super_TSymbol)._vptr_TSymbol[3])();
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_00,iVar1));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"no matching overloaded function found",pcVar3,"");
    this_local = (TParseContext *)0x0;
  }
  else {
    iVar1 = (*pTVar2->_vptr_TSymbol[7])();
    this_local = (TParseContext *)CONCAT44(extraout_var_01,iVar1);
  }
  return (TFunction *)this_local;
}

Assistant:

const TFunction* TParseContext::findFunctionExact(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn);
    if (symbol == nullptr) {
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");

        return nullptr;
    }

    return symbol->getAsFunction();
}